

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersTests.cpp
# Opt level: O3

bool deqp::egl::anon_unknown_4::checkColor(TestLog *log,TextureLevel *screen,Vec4 *color)

{
  ulong uVar1;
  ostringstream *this;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ConstPixelBufferAccess *access;
  void *__buf;
  int iVar5;
  int z;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Vec4 pixel;
  Vector<bool,_4> res;
  string local_228;
  string local_208;
  undefined1 local_1e8 [56];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  iVar5 = (screen->m_size).m_data[1];
  if (0 < iVar5) {
    iVar3 = (screen->m_size).m_data[0];
    z = 0;
    do {
      if (0 < iVar3) {
        iVar5 = 0;
        do {
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,screen);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1e8,(int)(ConstPixelBufferAccess *)local_1b0,
                     iVar5,z);
          fVar6 = (float)local_1e8._0_4_ - color->m_data[0];
          fVar7 = (float)local_1e8._4_4_ - color->m_data[1];
          fVar8 = (float)local_1e8._8_4_ - color->m_data[2];
          fVar9 = (float)local_1e8._12_4_ - color->m_data[3];
          auVar10._0_8_ = CONCAT44(fVar7,fVar6) ^ 0x8000000080000000;
          auVar10._8_4_ = -fVar8;
          auVar10._12_4_ = -fVar9;
          auVar11._4_4_ = fVar7;
          auVar11._0_4_ = fVar6;
          auVar11._8_4_ = fVar8;
          auVar11._12_4_ = fVar9;
          auVar11 = maxps(auVar10,auVar11);
          auVar12._4_4_ = -(uint)(auVar11._4_4_ <= 0.01);
          auVar12._0_4_ = -(uint)(auVar11._0_4_ <= 0.01);
          auVar12._8_4_ = -(uint)(auVar11._8_4_ <= 0.01);
          auVar12._12_4_ = -(uint)(auVar11._12_4_ <= 1.0);
          auVar11 = packssdw(auVar12,auVar12);
          auVar11 = packsswb(auVar11,auVar11);
          local_1b0._0_4_ = SUB164(auVar11 & _DAT_01b805f0,0);
          if (SUB161(auVar11 & _DAT_01b805f0,0) == '\0') {
LAB_00e2ad98:
            this = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,"Unexpected color values read from screen expected: ",0x33);
            tcu::operator<<((ostream *)this,color);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this);
            std::ios_base::~ios_base(local_138);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Screen","");
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Screen","");
            tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)(local_1e8 + 0x10),screen);
            access = (ConstPixelBufferAccess *)(local_1e8 + 0x10);
            tcu::LogImage::LogImage
                      ((LogImage *)local_1b0,&local_208,&local_228,access,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)access);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_p != local_180) {
              operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._0_8_ != &local_1a0) {
              operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            return false;
          }
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 2) goto LAB_00e2ad73;
            uVar1 = uVar4 + 1;
            lVar2 = uVar4 + 2;
            uVar4 = uVar1;
          } while (local_1b0[lVar2] != '\0');
          if (uVar1 < 3) goto LAB_00e2ad98;
LAB_00e2ad73:
          iVar5 = iVar5 + 1;
          iVar3 = (screen->m_size).m_data[0];
        } while (iVar5 < iVar3);
        iVar5 = (screen->m_size).m_data[1];
      }
      z = z + 1;
    } while (z < iVar5);
  }
  return true;
}

Assistant:

deUint32 createGLES2Program (const glw::Functions& gl, TestLog& log)
{
	const char* const vertexShaderSource =
	"attribute highp vec2 a_pos;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}";

	const char* const fragmentShaderSource =
	"void main (void)\n"
	"{\n"
	"\tgl_FragColor = vec4(0.9, 0.1, 0.4, 1.0);\n"
	"}";

	deUint32	program			= 0;
	deUint32	vertexShader	= 0;
	deUint32	fragmentShader	= 0;

	deInt32		vertexCompileStatus;
	string		vertexInfoLog;
	deInt32		fragmentCompileStatus;
	string		fragmentInfoLog;
	deInt32		linkStatus;
	string		programInfoLog;

	try
	{
		program			= gl.createProgram();
		vertexShader	= gl.createShader(GL_VERTEX_SHADER);
		fragmentShader	= gl.createShader(GL_FRAGMENT_SHADER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create shaders and program");

		gl.shaderSource(vertexShader, 1, &vertexShaderSource, DE_NULL);
		gl.compileShader(vertexShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup vertex shader");

		gl.shaderSource(fragmentShader, 1, &fragmentShaderSource, DE_NULL);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup fragment shader");

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(vertexShader, GL_COMPILE_STATUS, &vertexCompileStatus);
			gl.getShaderiv(vertexShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			vertexInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(vertexShader, (glw::GLsizei)vertexInfoLog.length(), &infoLogLength, &(vertexInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get vertex shader compile info");

			vertexInfoLog.resize(infoLogLength);
		}

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(fragmentShader, GL_COMPILE_STATUS, &fragmentCompileStatus);
			gl.getShaderiv(fragmentShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			fragmentInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(fragmentShader, (glw::GLsizei)fragmentInfoLog.length(), &infoLogLength, &(fragmentInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get fragment shader compile info");

			fragmentInfoLog.resize(infoLogLength);
		}

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup program");

		{
			deInt32		infoLogLength = 0;

			gl.getProgramiv(program, GL_LINK_STATUS, &linkStatus);
			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &infoLogLength);

			programInfoLog.resize(infoLogLength, '\0');

			gl.getProgramInfoLog(program, (glw::GLsizei)programInfoLog.length(), &infoLogLength, &(programInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get program link info");

			programInfoLog.resize(infoLogLength);
		}

		if (linkStatus == 0 || vertexCompileStatus == 0 || fragmentCompileStatus == 0)
		{

			log.startShaderProgram(linkStatus != 0, programInfoLog.c_str());

			log << TestLog::Shader(QP_SHADER_TYPE_VERTEX, vertexShaderSource, vertexCompileStatus != 0, vertexInfoLog);
			log << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT, fragmentShaderSource, fragmentCompileStatus != 0, fragmentInfoLog);

			log.endShaderProgram();
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to delete shaders");

		TCU_CHECK(linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0);
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		if (vertexShader)
			gl.deleteShader(vertexShader);

		if (fragmentShader)
			gl.deleteShader(fragmentShader);

		throw;
	}

	return program;
}